

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::RawProgramWrapper::writeToLog
          (RawProgramWrapper *this,TestLog *log)

{
  qpShaderType type;
  undefined8 this_00;
  string *psVar1;
  TestLog *pTVar2;
  allocator<char> local_e9;
  string local_e8;
  LogShader local_c8;
  LogShaderProgram local_78;
  qpShaderType local_3c;
  undefined1 local_38 [4];
  qpShaderType qpType;
  string info;
  TestLog *log_local;
  RawProgramWrapper *this_local;
  
  info.field_2._8_8_ = log;
  psVar1 = glu::Program::getInfoLog_abi_cxx11_(&this->m_program);
  std::__cxx11::string::string((string *)local_38,(string *)psVar1);
  local_3c = glu::getLogShaderType(this->m_shaderType);
  this_00 = info.field_2._8_8_;
  tcu::LogShaderProgram::LogShaderProgram(&local_78,true,(string *)local_38);
  pTVar2 = tcu::TestLog::operator<<((TestLog *)this_00,&local_78);
  type = local_3c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"[Shader created by glCreateShaderProgramv()]",&local_e9);
  tcu::LogShader::LogShader(&local_c8,type,&this->m_source,true,&local_e8);
  pTVar2 = tcu::TestLog::operator<<(pTVar2,&local_c8);
  tcu::TestLog::operator<<(pTVar2,(EndShaderProgramToken *)&tcu::TestLog::EndShaderProgram);
  tcu::LogShader::~LogShader(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  tcu::LogShaderProgram::~LogShaderProgram(&local_78);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void RawProgramWrapper::writeToLog (TestLog& log)
{
	const string	info	= m_program.getInfoLog();
	qpShaderType	qpType	= glu::getLogShaderType(m_shaderType);

	log << TestLog::ShaderProgram(true, info)
		<< TestLog::Shader(qpType, m_source,
						   true, "[Shader created by glCreateShaderProgramv()]")
		<< TestLog::EndShaderProgram;
}